

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TessellationTests::init(TessellationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  _Alloc_hider _Var3;
  _Alloc_hider __s;
  TestNode *node;
  LimitQueryCase *pLVar4;
  CombinedUniformLimitCase *pCVar5;
  TestCase *pTVar6;
  TestNode *pTVar7;
  ReferencedByTessellationQueryCase *pRVar8;
  TestCaseGroup *pTVar9;
  char *pcVar10;
  int i;
  uint uVar11;
  int iVar12;
  long lVar13;
  char *description;
  undefined **local_1e0;
  string primName;
  string primSpacName;
  int outSize;
  int inSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string caseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [3];
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "Query tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_patch_vertices",
             "Test MAX_PATCH_VERTICES",0x8e7d,0x20);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_gen_level",
             "Test MAX_TESS_GEN_LEVEL",0x8e7e,0x40);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_uniform_components",
             "Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",0x8e7f,0x400);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_uniform_components",
             "Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",0x8e80,0x400);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_texture_image_units",
             "Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",0x8e81,0x10);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_texture_image_units",
             "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",0x8e82,0x10);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_output_components",
             "Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",0x8e83,0x40);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_patch_components",
             "Test MAX_TESS_PATCH_COMPONENTS",0x8e84,0x78);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_total_output_components"
             ,"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",0x8e85,0x800);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_output_components",
             "Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",0x8e86,0x40);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_uniform_blocks",
             "Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",0x8e89,0xc);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_uniform_blocks",
             "Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",0x8e8a,0xc);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_input_components",
             "Test MAX_TESS_CONTROL_INPUT_COMPONENTS",0x886c,0x40);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_input_components",
             "Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",0x886d,0x40);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_atomic_counter_buffers",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",0x92cd,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,
             "max_tess_evaluation_atomic_counter_buffers",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",0x92ce,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_atomic_counters",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",0x92d3,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_atomic_counters",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",0x92d4,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_image_uniforms",
             "Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",0x90cb,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_image_uniforms",
             "Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",0x90cc,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_tess_control_shader_storage_blocks",
             "Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",0x90d8,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,
             "max_tess_evaluation_shader_storage_blocks",
             "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",0x90d9,0);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_uniform_buffer_bindings",
             "Test MAX_UNIFORM_BUFFER_BINDINGS",0x8a2f,0x48);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_combined_uniform_blocks",
             "Test MAX_COMBINED_UNIFORM_BLOCKS",0x8a2e,0x3c);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pLVar4 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar4,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,0x60);
  tcu::TestNode::addChild(node,(TestNode *)pLVar4);
  pCVar5 = (CombinedUniformLimitCase *)operator_new(0x88);
  anon_unknown_1::CombinedUniformLimitCase::CombinedUniformLimitCase
            (pCVar5,(this->super_TestCaseGroup).m_context,
             "max_combined_tess_control_uniform_components",
             "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",0x8e1e,0x8e89,0x8e7f);
  tcu::TestNode::addChild(node,(TestNode *)pCVar5);
  pCVar5 = (CombinedUniformLimitCase *)operator_new(0x88);
  anon_unknown_1::CombinedUniformLimitCase::CombinedUniformLimitCase
            (pCVar5,(this->super_TestCaseGroup).m_context,
             "max_combined_tess_evaluation_uniform_components",
             "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",0x8e1f,0x8e8a,0x8e80);
  tcu::TestNode::addChild(node,(TestNode *)pCVar5);
  pTVar6 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar6,(this->super_TestCaseGroup).m_context,"primitive_restart_for_patches_supported",
             "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED");
  (pTVar6->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e47f98;
  tcu::TestNode::addChild(node,(TestNode *)pTVar6);
  pTVar6 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar6,(this->super_TestCaseGroup).m_context,"patch_vertices","Test PATCH_VERTICES");
  (pTVar6->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e47fe8;
  tcu::TestNode::addChild(node,(TestNode *)pTVar6);
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessProgramQueryCase::TessProgramQueryCase
            ((TessProgramQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "tess_control_output_vertices","Test TESS_CONTROL_OUTPUT_VERTICES");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e48038;
  tcu::TestNode::addChild(node,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessProgramQueryCase::TessProgramQueryCase
            ((TessProgramQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,"tess_gen_mode",
             "Test TESS_GEN_MODE");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e480d8;
  tcu::TestNode::addChild(node,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessProgramQueryCase::TessProgramQueryCase
            ((TessProgramQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,"tess_gen_spacing"
             ,"Test TESS_GEN_SPACING");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e48178;
  tcu::TestNode::addChild(node,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessProgramQueryCase::TessProgramQueryCase
            ((TessProgramQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "tess_gen_vertex_order","Test TESS_GEN_VERTEX_ORDER");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e48230;
  tcu::TestNode::addChild(node,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessProgramQueryCase::TessProgramQueryCase
            ((TessProgramQueryCase *)pTVar7,(this->super_TestCaseGroup).m_context,
             "tess_gen_point_mode","Test TESS_GEN_POINT_MODE");
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_01e482c8;
  tcu::TestNode::addChild(node,pTVar7);
  pRVar8 = (ReferencedByTessellationQueryCase *)operator_new(0x80);
  anon_unknown_1::ReferencedByTessellationQueryCase::ReferencedByTessellationQueryCase
            (pRVar8,(this->super_TestCaseGroup).m_context,"referenced_by_tess_control_shader",
             "Test REFERENCED_BY_TESS_CONTROL_SHADER",true);
  tcu::TestNode::addChild(node,(TestNode *)pRVar8);
  pRVar8 = (ReferencedByTessellationQueryCase *)operator_new(0x80);
  anon_unknown_1::ReferencedByTessellationQueryCase::ReferencedByTessellationQueryCase
            (pRVar8,(this->super_TestCaseGroup).m_context,"referenced_by_tess_evaluation_shader",
             "Test REFERENCED_BY_TESS_EVALUATION_SHADER",false);
  tcu::TestNode::addChild(node,(TestNode *)pRVar8);
  pTVar6 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar6,(this->super_TestCaseGroup).m_context,"is_per_patch","Test IS_PER_PATCH");
  (pTVar6->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e483a0;
  tcu::TestNode::addChild(node,(TestNode *)pTVar6);
  pTVar9 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar9,(this->super_TestCaseGroup).m_context,"tesscoord",
             "Get tessellation coordinates with transform feedback and validate them");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar9);
  for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
    local_1e0 = &PTR_anon_var_dwarf_904311_01e48d98;
    for (iVar12 = 0; iVar12 != 3; iVar12 = iVar12 + 1) {
      pTVar6 = (TestCase *)operator_new(0x90);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      local_f0._M_string_length = 0;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0.field_2._M_local_buf[0] = '\0';
      if (uVar11 < 3) {
        pcVar10 = (char *)(&DAT_01e48d80)[uVar11];
      }
      else {
        pcVar10 = (char *)0x0;
      }
      std::operator+(local_90,&local_f0,pcVar10);
      std::operator+(&local_b0,local_90,"_");
      std::operator+(&caseName,&local_b0,*local_1e0);
      gles31::TestCase::TestCase
                (pTVar6,pCVar1,caseName._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1);
      (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TessCoordCase_01e483f0;
      *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = uVar11;
      *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar12;
      pTVar6[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pTVar6);
      std::__cxx11::string::~string((string *)&caseName);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      local_1e0 = local_1e0 + 1;
    }
  }
  pTVar9 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar9,(this->super_TestCaseGroup).m_context,"winding",
             "Test the cw and ccw input layout qualifiers");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar9);
  local_1e0 = (undefined **)0x0;
  do {
    if ((uint)local_1e0 != 2) {
      if ((uint)local_1e0 == 3) {
        pTVar9 = (TestCaseGroup *)operator_new(0x78);
        TestCaseGroup::TestCaseGroup
                  (pTVar9,(this->super_TestCaseGroup).m_context,"shader_input_output",
                   "Test tessellation control and evaluation shader inputs and outputs");
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar9);
        lVar13 = 0;
        while( true ) {
          if (lVar13 == 2) break;
          inSize = init::patchVertexCountCases[lVar13].inPatchSize;
          outSize = init::patchVertexCountCases[lVar13].outPatchSize;
          de::toString<int>(&primName,&inSize);
          std::operator+(&local_f0,"patch_vertices_",&primName);
          std::operator+(local_90,&local_f0,"_in_");
          de::toString<int>(&primSpacName,&outSize);
          std::operator+(&local_b0,local_90,&primSpacName);
          std::operator+(&caseName,&local_b0,"_out");
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&primSpacName);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&primName);
          pTVar6 = (TestCase *)operator_new(0xb0);
          _Var3 = caseName._M_dataplus;
          iVar2 = inSize;
          iVar12 = outSize;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::operator+(local_90,"data/tessellation/",&caseName);
          std::operator+(&local_b0,local_90,"_ref.png");
          __s._M_p = local_b0._M_dataplus._M_p;
          gles31::TestCase::TestCase
                    (pTVar6,pCVar1,_Var3._M_p,"Test input and output patch vertex counts");
          (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__PatchVertexCountCase_01e48490;
          *(int *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = iVar2;
          *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar12;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx,__s._M_p,
                     (allocator<char> *)&local_f0);
          *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
          pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pTVar6);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&caseName);
          lVar13 = lVar13 + 1;
        }
        description = "Read gl_PrimitiveID in TCS and pass it as patch output to TES";
        pcVar10 = "primitive_id_tcs";
        local_1e0._0_4_ = 0;
        do {
          pTVar6 = (TestCase *)operator_new(0xb0);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          local_f0._M_string_length = 0;
          local_f0.field_2._M_local_buf[0] = '\0';
          std::operator+(local_90,&local_f0,"data/tessellation/");
          std::operator+(&local_b0,local_90,pcVar10);
          std::operator+(&caseName,&local_b0,"_ref.png");
          _Var3 = caseName._M_dataplus;
          gles31::TestCase::TestCase(pTVar6,pCVar1,pcVar10,description);
          (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__PerPatchDataCase_01e484e0;
          *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = (uint)local_1e0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pTVar6[1].super_TestCase.super_TestNode.m_testCtx,_Var3._M_p,
                     (allocator<char> *)&primName);
          *(undefined8 *)((long)&pTVar6[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
          pTVar6[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pTVar6);
          std::__cxx11::string::~string((string *)&caseName);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_f0);
          local_1e0._0_4_ = (uint)local_1e0 + 1;
          description = "Read gl_PrimitiveID in TES";
          pcVar10 = "primitive_id_tes";
        } while( true );
      }
      for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
        pTVar6 = (TestCase *)operator_new(0x90);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        local_f0._M_string_length = 0;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        local_f0.field_2._M_local_buf[0] = '\0';
        if ((uint)local_1e0 < 3) {
          pcVar10 = (char *)(&DAT_01e48d80)[(long)local_1e0];
        }
        else {
          pcVar10 = (char *)0x0;
        }
        std::operator+(local_90,&local_f0,pcVar10);
        std::operator+(&local_b0,local_90,"_");
        pcVar10 = (char *)0x0;
        if (iVar12 == 1) {
          pcVar10 = "cw";
        }
        if (iVar12 == 0) {
          pcVar10 = "ccw";
        }
        std::operator+(&caseName,&local_b0,pcVar10);
        gles31::TestCase::TestCase
                  (pTVar6,pCVar1,caseName._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1)
        ;
        (pTVar6->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__WindingCase_01e48440;
        *(uint *)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode = (uint)local_1e0;
        *(int *)((long)&pTVar6[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar12;
        pTVar6[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        pTVar6[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
        tcu::TestNode::addChild((TestNode *)pTVar9,(TestNode *)pTVar6);
        std::__cxx11::string::~string((string *)&caseName);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
    local_1e0 = (undefined **)(ulong)((uint)local_1e0 + 1);
  } while( true );
}

Assistant:

void TessellationTests::init (void)
{
	{
		tcu::TestCaseGroup* const queryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "Query tests");
		addChild(queryGroup);

		// new limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_patch_vertices",								"Test MAX_PATCH_VERTICES",								GL_MAX_PATCH_VERTICES,							32));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_gen_level",								"Test MAX_TESS_GEN_LEVEL",								GL_MAX_TESS_GEN_LEVEL,							64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_components",				"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",				GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_components",			"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",			GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_texture_image_units",				"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_texture_image_units",			"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_output_components",				"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_patch_components",							"Test MAX_TESS_PATCH_COMPONENTS",						GL_MAX_TESS_PATCH_COMPONENTS,					120));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_total_output_components",			"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_output_components",				"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_blocks",					"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",					GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_blocks",				"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",				GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_input_components",					"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_input_components",				"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counter_buffers",			"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counter_buffers",		"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counters",					"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",				GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counters",				"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",				GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_image_uniforms",					"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",					GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_image_uniforms",				"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",				GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_shader_storage_blocks",			"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",			GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_shader_storage_blocks",			"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0));

		// modified limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_uniform_buffer_bindings",						"Test MAX_UNIFORM_BUFFER_BINDINGS",						GL_MAX_UNIFORM_BUFFER_BINDINGS,					72));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_uniform_blocks",						"Test MAX_COMBINED_UNIFORM_BLOCKS",						GL_MAX_COMBINED_UNIFORM_BLOCKS,					60));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_texture_image_units",					"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,			96));

		// combined limits
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_control_uniform_components",		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,		GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,		GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS));
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_evaluation_uniform_components",		"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS,		GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,	GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS));

		// features
		queryGroup->addChild(new PrimitiveRestartForPatchesSupportedCase(m_context, "primitive_restart_for_patches_supported", "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED"));

		// states
		queryGroup->addChild(new PatchVerticesStateCase(m_context, "patch_vertices", "Test PATCH_VERTICES"));

		// program states
		queryGroup->addChild(new TessControlOutputVerticesCase	(m_context, "tess_control_output_vertices",	"Test TESS_CONTROL_OUTPUT_VERTICES"));
		queryGroup->addChild(new TessGenModeQueryCase			(m_context, "tess_gen_mode",				"Test TESS_GEN_MODE"));
		queryGroup->addChild(new TessGenSpacingQueryCase		(m_context, "tess_gen_spacing",				"Test TESS_GEN_SPACING"));
		queryGroup->addChild(new TessGenVertexOrderQueryCase	(m_context, "tess_gen_vertex_order",		"Test TESS_GEN_VERTEX_ORDER"));
		queryGroup->addChild(new TessGenPointModeQueryCase		(m_context, "tess_gen_point_mode",			"Test TESS_GEN_POINT_MODE"));

		// resource queries
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_control_shader",	"Test REFERENCED_BY_TESS_CONTROL_SHADER",		true));
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_evaluation_shader",	"Test REFERENCED_BY_TESS_EVALUATION_SHADER",	false));
		queryGroup->addChild(new IsPerPatchQueryCase				(m_context, "is_per_patch",							"Test IS_PER_PATCH"));
	}

	{
		TestCaseGroup* const tessCoordGroup = new TestCaseGroup(m_context, "tesscoord", "Get tessellation coordinates with transform feedback and validate them");
		addChild(tessCoordGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				tessCoordGroup->addChild(new TessCoordCase(m_context,
														   (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName((SpacingMode)spacingI)).c_str(), "",
														   primitiveType, (SpacingMode)spacingI));
		}
	}

	{
		TestCaseGroup* const windingGroup = new TestCaseGroup(m_context, "winding", "Test the cw and ccw input layout qualifiers");
		addChild(windingGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			for (int windingI = 0; windingI < WINDING_LAST; windingI++)
			{
				const Winding winding = (Winding)windingI;
				windingGroup->addChild(new WindingCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getWindingShaderName(winding)).c_str(), "", primitiveType, winding));
			}
		}
	}

	{
		TestCaseGroup* const shaderInputOutputGroup = new TestCaseGroup(m_context, "shader_input_output", "Test tessellation control and evaluation shader inputs and outputs");
		addChild(shaderInputOutputGroup);

		{
			static const struct
			{
				int inPatchSize;
				int outPatchSize;
			} patchVertexCountCases[] =
			{
				{  5, 10 },
				{ 10,  5 }
			};

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(patchVertexCountCases); caseNdx++)
			{
				const int inSize	= patchVertexCountCases[caseNdx].inPatchSize;
				const int outSize	= patchVertexCountCases[caseNdx].outPatchSize;

				const string caseName = "patch_vertices_" + de::toString(inSize) + "_in_" + de::toString(outSize) + "_out";

				shaderInputOutputGroup->addChild(new PatchVertexCountCase(m_context, caseName.c_str(), "Test input and output patch vertex counts", inSize, outSize,
																		  ("data/tessellation/" + caseName + "_ref.png").c_str()));
			}
		}

		for (int caseTypeI = 0; caseTypeI < PerPatchDataCase::CASETYPE_LAST; caseTypeI++)
		{
			const PerPatchDataCase::CaseType	caseType	= (PerPatchDataCase::CaseType)caseTypeI;
			const char* const					caseName	= PerPatchDataCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new PerPatchDataCase(m_context, caseName, PerPatchDataCase::getCaseTypeDescription(caseType), caseType,
																  PerPatchDataCase::caseTypeUsesRefImageFromFile(caseType) ? (string() + "data/tessellation/" + caseName + "_ref.png").c_str() : DE_NULL));
		}

		for (int caseTypeI = 0; caseTypeI < GLPositionCase::CASETYPE_LAST; caseTypeI++)
		{
			const GLPositionCase::CaseType	caseType	= (GLPositionCase::CaseType)caseTypeI;
			const char* const				caseName	= GLPositionCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new GLPositionCase(m_context, caseName, "", caseType, "data/tessellation/gl_position_ref.png"));
		}

		shaderInputOutputGroup->addChild(new BarrierCase(m_context, "barrier", "Basic barrier usage", "data/tessellation/barrier_ref.png"));
	}

	{
		TestCaseGroup* const miscDrawGroup = new TestCaseGroup(m_context, "misc_draw", "Miscellaneous draw-result-verifying cases");
		addChild(miscDrawGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_cover_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillCoverCase(m_context,
																	   caseName.c_str(), "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
																	   primitiveType, (SpacingMode)spacingI,
																	   ("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_overlap_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillNonOverlapCase(m_context,
																			caseName.c_str(), "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
																			primitiveType, (SpacingMode)spacingI,
																			("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
		{
			const string caseName = string() + "isolines_" + getSpacingModeShaderName((SpacingMode)spacingI);

			miscDrawGroup->addChild(new IsolinesRenderCase(m_context,
														   caseName.c_str(), "Basic isolines render test",
														   (SpacingMode)spacingI,
														   ("data/tessellation/" + caseName + "_ref").c_str()));
		}
	}

	{
		TestCaseGroup* const commonEdgeGroup = new TestCaseGroup(m_context, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them");
		addChild(commonEdgeGroup);

		for (int caseTypeI = 0; caseTypeI < CommonEdgeCase::CASETYPE_LAST; caseTypeI++)
		{
			for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
			{
				const CommonEdgeCase::CaseType	caseType		= (CommonEdgeCase::CaseType)caseTypeI;
				const TessPrimitiveType			primitiveType	= (TessPrimitiveType)primitiveTypeI;
				if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
						continue;

				for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				{
					const SpacingMode	spacing		= (SpacingMode)spacingI;
					const string		caseName	= (string() + getTessPrimitiveTypeShaderName(primitiveType)
																+ "_" + getSpacingModeShaderName(spacing)
																+ (caseType == CommonEdgeCase::CASETYPE_BASIC		? ""
																 : caseType == CommonEdgeCase::CASETYPE_PRECISE		? "_precise"
																 : DE_NULL));

					commonEdgeGroup->addChild(new CommonEdgeCase(m_context, caseName.c_str(), "", primitiveType, spacing, caseType));
				}
			}
		}
	}

	{
		TestCaseGroup* const fractionalSpacingModeGroup = new TestCaseGroup(m_context, "fractional_spacing", "Test fractional spacing modes");
		addChild(fractionalSpacingModeGroup);

		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "odd",	"", SPACINGMODE_FRACTIONAL_ODD));
		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "even",	"", SPACINGMODE_FRACTIONAL_EVEN));
	}

	{
		TestCaseGroup* const primitiveDiscardGroup = new TestCaseGroup(m_context, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0");
		addChild(primitiveDiscardGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
						const SpacingMode			spacing			= (SpacingMode)spacingI;
						const Winding				winding			= (Winding)windingI;
						const bool					usePointMode	= usePointModeI != 0;

						primitiveDiscardGroup->addChild(new PrimitiveDiscardCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType)
																									  + "_" + getSpacingModeShaderName(spacing)
																									  + "_" + getWindingShaderName(winding)
																									  + (usePointMode ? "_point_mode" : "")).c_str(), "",
																				 primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		TestCaseGroup* const invarianceGroup							= new TestCaseGroup(m_context, "invariance",						"Test tessellation invariance rules");

		TestCaseGroup* const invariantPrimitiveSetGroup					= new TestCaseGroup(m_context, "primitive_set",						"Test invariance rule #1");
		TestCaseGroup* const invariantOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_division",				"Test invariance rule #2");
		TestCaseGroup* const symmetricOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_symmetry",				"Test invariance rule #3");
		TestCaseGroup* const outerEdgeVertexSetIndexIndependenceGroup	= new TestCaseGroup(m_context, "outer_edge_index_independence",		"Test invariance rule #4");
		TestCaseGroup* const invariantTriangleSetGroup					= new TestCaseGroup(m_context, "triangle_set",						"Test invariance rule #5");
		TestCaseGroup* const invariantInnerTriangleSetGroup				= new TestCaseGroup(m_context, "inner_triangle_set",				"Test invariance rule #6");
		TestCaseGroup* const invariantOuterTriangleSetGroup				= new TestCaseGroup(m_context, "outer_triangle_set",				"Test invariance rule #7");
		TestCaseGroup* const tessCoordComponentRangeGroup				= new TestCaseGroup(m_context, "tess_coord_component_range",		"Test invariance rule #8, first part");
		TestCaseGroup* const oneMinusTessCoordComponentGroup			= new TestCaseGroup(m_context, "one_minus_tess_coord_component",	"Test invariance rule #8, second part");

		addChild(invarianceGroup);
		invarianceGroup->addChild(invariantPrimitiveSetGroup);
		invarianceGroup->addChild(invariantOuterEdgeGroup);
		invarianceGroup->addChild(symmetricOuterEdgeGroup);
		invarianceGroup->addChild(outerEdgeVertexSetIndexIndependenceGroup);
		invarianceGroup->addChild(invariantTriangleSetGroup);
		invarianceGroup->addChild(invariantInnerTriangleSetGroup);
		invarianceGroup->addChild(invariantOuterTriangleSetGroup);
		invarianceGroup->addChild(tessCoordComponentRangeGroup);
		invarianceGroup->addChild(oneMinusTessCoordComponentGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
			const string				primName		= getTessPrimitiveTypeShaderName(primitiveType);
			const bool					triOrQuad		= primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const SpacingMode	spacing			= (SpacingMode)spacingI;
				const string		primSpacName	= primName + "_" + getSpacingModeShaderName(spacing);

				if (triOrQuad)
				{
					invariantOuterEdgeGroup->addChild		(new InvariantOuterEdgeCase			(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantTriangleSetGroup->addChild		(new InvariantTriangleSetCase		(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantInnerTriangleSetGroup->addChild(new InvariantInnerTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantOuterTriangleSetGroup->addChild(new InvariantOuterTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
				}

				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					const Winding	winding				= (Winding)windingI;
					const string	primSpacWindName	= primSpacName + "_" + getWindingShaderName(winding);

					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const bool		usePointMode			= usePointModeI != 0;
						const string	primSpacWindPointName	= primSpacWindName + (usePointMode ? "_point_mode" : "");

						invariantPrimitiveSetGroup->addChild		(new InvariantPrimitiveSetCase			(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						symmetricOuterEdgeGroup->addChild			(new SymmetricOuterEdgeCase				(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						tessCoordComponentRangeGroup->addChild		(new TessCoordComponentRangeCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						oneMinusTessCoordComponentGroup->addChild	(new OneMinusTessCoordComponentCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));

						if (triOrQuad)
							outerEdgeVertexSetIndexIndependenceGroup->addChild(new OuterEdgeVertexSetIndexIndependenceCase(m_context, primSpacWindPointName.c_str(), "",
																														   primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		static const struct
		{
			const char*					name;
			const char*					description;
			UserDefinedIOCase::IOType	ioType;
		} ioCases[] =
		{
			{ "per_patch",					"Per-patch TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_PATCH				},
			{ "per_patch_array",			"Per-patch array TCS outputs",				UserDefinedIOCase::IO_TYPE_PER_PATCH_ARRAY			},
			{ "per_patch_block",			"Per-patch TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK			},
			{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
			{ "per_vertex",					"Per-vertex TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_VERTEX				},
			{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK			},
		};

		TestCaseGroup* const userDefinedIOGroup = new TestCaseGroup(m_context, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs");
		addChild(userDefinedIOGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ioCases); ++ndx)
		{
			TestCaseGroup* const ioTypeGroup = new TestCaseGroup(m_context, ioCases[ndx].name, ioCases[ndx].description);
			userDefinedIOGroup->addChild(ioTypeGroup);

			for (int vertexArraySizeI = 0; vertexArraySizeI < UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_LAST; vertexArraySizeI++)
			{
				const UserDefinedIOCase::VertexIOArraySize	vertexArraySize			= (UserDefinedIOCase::VertexIOArraySize)vertexArraySizeI;
				TestCaseGroup* const						vertexArraySizeGroup	= new TestCaseGroup(m_context,
																										vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_IMPLICIT
																											? "vertex_io_array_size_implicit"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN
																											? "vertex_io_array_size_shader_builtin"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY
																											? "vertex_io_array_size_query"
																									  : DE_NULL,
																									    "");
				ioTypeGroup->addChild(vertexArraySizeGroup);

				for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
				{
					const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
					vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, getTessPrimitiveTypeShaderName(primitiveType), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_IMPLICIT,
																		 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
				}

				if (ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX
					|| ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK)
				{
					for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
					{
						const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
						vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, (string(getTessPrimitiveTypeShaderName(primitiveType)) + "_explicit_tcs_out_size").c_str(), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT,
																			 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
					}
				}
			}
		}

		{
			de::MovePtr<TestCaseGroup>	negativeGroup	(new TestCaseGroup(m_context, "negative", "Negative cases"));

			{
				de::MovePtr<TestCaseGroup>			es31Group		(new TestCaseGroup(m_context, "es31", "GLSL ES 3.1 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es31Group->addChild(children[i]);

				negativeGroup->addChild(es31Group.release());
			}

			{
				de::MovePtr<TestCaseGroup>			es32Group		(new TestCaseGroup(m_context, "es32", "GLSL ES 3.2 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es32Group->addChild(children[i]);

				negativeGroup->addChild(es32Group.release());
			}

			userDefinedIOGroup->addChild(negativeGroup.release());
		}
	}
}